

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O3

int CRYPTO_set_thread_local
              (thread_local_data_t index,void *value,thread_local_destructor_t destructor)

{
  int iVar1;
  void *__pointer;
  
  iVar1 = pthread_once(&g_thread_local_init_once,thread_local_init);
  if (iVar1 != 0) {
    abort();
  }
  if (g_thread_local_key_created == 0) goto LAB_001a338d;
  __pointer = pthread_getspecific(g_thread_local_key);
  if (__pointer == (void *)0x0) {
    __pointer = calloc(1,0x28);
    if (__pointer == (void *)0x0) goto LAB_001a338d;
    iVar1 = pthread_setspecific(g_thread_local_key,__pointer);
    if (iVar1 != 0) {
      free(__pointer);
      goto LAB_001a338d;
    }
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_destructors_lock);
  if (iVar1 == 0) {
    g_destructors[index] = destructor;
    pthread_mutex_unlock((pthread_mutex_t *)&g_destructors_lock);
    *(void **)((long)__pointer + (ulong)index * 8) = value;
    return 1;
  }
LAB_001a338d:
  (*destructor)(value);
  return 0;
}

Assistant:

int CRYPTO_set_thread_local(thread_local_data_t index, void *value,
                            thread_local_destructor_t destructor) {
  CRYPTO_once(&g_thread_local_init_once, thread_local_init);
  if (!g_thread_local_key_created) {
    destructor(value);
    return 0;
  }

  void **pointers =
      reinterpret_cast<void **>(pthread_getspecific(g_thread_local_key));
  if (pointers == NULL) {
    pointers = reinterpret_cast<void **>(
        malloc(sizeof(void *) * NUM_OPENSSL_THREAD_LOCALS));
    if (pointers == NULL) {
      destructor(value);
      return 0;
    }
    OPENSSL_memset(pointers, 0, sizeof(void *) * NUM_OPENSSL_THREAD_LOCALS);
    if (pthread_setspecific(g_thread_local_key, pointers) != 0) {
      free(pointers);
      destructor(value);
      return 0;
    }
  }

  if (pthread_mutex_lock(&g_destructors_lock) != 0) {
    destructor(value);
    return 0;
  }
  g_destructors[index] = destructor;
  pthread_mutex_unlock(&g_destructors_lock);

  pointers[index] = value;
  return 1;
}